

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

GLint __thiscall
deqp::gles3::Functional::ShaderSourceReplaceCase::getSourceLength
          (ShaderSourceReplaceCase *this,Shader *shader)

{
  deUint32 shader_00;
  GLenum err;
  GLint local_1c;
  Shader *pSStack_18;
  GLint sourceLength;
  Shader *shader_local;
  ShaderSourceReplaceCase *this_local;
  
  local_1c = 0;
  pSStack_18 = shader;
  shader_local = (Shader *)this;
  shader_00 = glu::Shader::getShader(shader);
  glu::CallLogWrapper::glGetShaderiv
            (&(this->super_ApiCase).super_CallLogWrapper,shader_00,0x8b88,&local_1c);
  err = glu::CallLogWrapper::glGetError(&(this->super_ApiCase).super_CallLogWrapper);
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                  ,0x26d);
  return local_1c;
}

Assistant:

GLint getSourceLength (glu::Shader& shader)
	{
		GLint sourceLength = 0;
		glGetShaderiv(shader.getShader(), GL_SHADER_SOURCE_LENGTH, &sourceLength);
		GLU_CHECK();

		return sourceLength;
	}